

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::NewKey
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          int key)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 uVar6;
  FName FVar7;
  short sVar8;
  char cVar9;
  undefined1 uVar10;
  int iVar11;
  undefined4 uVar12;
  Node *pNVar13;
  uint uVar14;
  Node *pNVar15;
  Node *pNVar16;
  
  while (uVar14 = this->Size - 1 & key, pNVar1 = this->Nodes + uVar14,
        this->Nodes[uVar14].Next != (Node *)0x1) {
    pNVar13 = GetFreePos(this);
    if (pNVar13 != (Node *)0x0) {
      pNVar16 = this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key) != pNVar1) goto LAB_004551c1;
      pNVar13->Next = pNVar1->Next;
      pNVar16 = pNVar13;
      goto LAB_004551f6;
    }
    Rehash(this);
  }
LAB_004551f1:
  pNVar13 = (Node *)0x0;
  pNVar16 = pNVar1;
LAB_004551f6:
  pNVar1->Next = pNVar13;
  this->NumUsed = this->NumUsed + 1;
  (pNVar16->Pair).Key = key;
  return pNVar16;
LAB_004551c1:
  do {
    pNVar15 = pNVar16;
    pNVar16 = pNVar15->Next;
  } while (pNVar16 != pNVar1);
  pNVar15->Next = pNVar13;
  pNVar16 = pNVar1->Next;
  iVar11 = (pNVar1->Pair).Key;
  uVar12 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
  FVar7.Index = (pNVar1->Pair).Value.classname.Index;
  sVar8 = (pNVar1->Pair).Value.special;
  cVar9 = (pNVar1->Pair).Value.argsdefined;
  uVar10 = (pNVar1->Pair).Value.field_0x7;
  uVar2 = *(undefined8 *)(pNVar1->Pair).Value.args;
  uVar3 = *(undefined8 *)((pNVar1->Pair).Value.args + 2);
  uVar4 = *(undefined8 *)((pNVar1->Pair).Value.args + 4);
  iVar5 = (pNVar1->Pair).Value.linenum;
  uVar6 = *(undefined4 *)&(pNVar1->Pair).Value.field_0x2c;
  (pNVar13->Pair).Value.filename.Chars = (pNVar1->Pair).Value.filename.Chars;
  (pNVar13->Pair).Value.linenum = iVar5;
  *(undefined4 *)&(pNVar13->Pair).Value.field_0x2c = uVar6;
  *(undefined8 *)((pNVar13->Pair).Value.args + 2) = uVar3;
  *(undefined8 *)((pNVar13->Pair).Value.args + 4) = uVar4;
  (pNVar13->Pair).Value.classname = (FName)FVar7.Index;
  (pNVar13->Pair).Value.special = sVar8;
  (pNVar13->Pair).Value.argsdefined = cVar9;
  (pNVar13->Pair).Value.field_0x7 = uVar10;
  *(undefined8 *)(pNVar13->Pair).Value.args = uVar2;
  pNVar13->Next = pNVar16;
  (pNVar13->Pair).Key = iVar11;
  *(undefined4 *)&(pNVar13->Pair).field_0x4 = uVar12;
  goto LAB_004551f1;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}